

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ManSupportSum(Nwk_Man_t *pNtk)

{
  int iVar1;
  uint local_28;
  int local_24;
  int nTotalSupps;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  Nwk_Man_t *pNtk_local;
  
  local_28 = 0;
  vSupp = (Vec_Ptr_t *)pNtk;
  for (local_24 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vSupp[1].pArray), local_24 < iVar1;
      local_24 = local_24 + 1) {
    _nTotalSupps = (Nwk_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vSupp[1].pArray,local_24);
    pObj = (Nwk_Obj_t *)Nwk_ManSupportNodes((Nwk_Man_t *)vSupp,(Nwk_Obj_t **)&nTotalSupps,1);
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj);
    local_28 = iVar1 + local_28;
    Vec_PtrFree((Vec_Ptr_t *)pObj);
  }
  printf("Total supports = %d.\n",(ulong)local_28);
  return;
}

Assistant:

void Nwk_ManSupportSum( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Nwk_Obj_t * pObj;
    int i, nTotalSupps = 0;
    Nwk_ManForEachCo( pNtk, pObj, i )
    {
        vSupp = Nwk_ManSupportNodes( pNtk, &pObj, 1 );
        nTotalSupps += Vec_PtrSize( vSupp );
        Vec_PtrFree( vSupp );
    }
    printf( "Total supports = %d.\n", nTotalSupps );
}